

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psroipooling.cpp
# Opt level: O2

int __thiscall
ncnn::PSROIPooling::forward
          (PSROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Mat *this_00;
  Mat *this_01;
  undefined1 auVar6 [16];
  undefined4 extraout_EAX;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float local_12c;
  float local_128;
  float fStack_124;
  void *local_f8;
  float fStack_e4;
  Mat local_70;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00->c == this->pooled_width * this->output_dim * this->pooled_height) {
    uVar3 = this_00->w;
    uVar18 = (ulong)(int)uVar3;
    iVar4 = this_00->h;
    this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,this->pooled_width,this->pooled_height,this->output_dim,this_00->elemsize,
                opt->blob_allocator);
    iVar20 = -100;
    if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
      uVar1 = *this_00[1].data;
      uVar2 = *(undefined8 *)((long)this_00[1].data + 8);
      fVar22 = roundf((float)uVar1);
      fStack_e4 = (float)((ulong)uVar1 >> 0x20);
      fVar23 = roundf(fStack_e4);
      fVar26 = this->spatial_scale;
      fVar22 = fVar22 * fVar26;
      fVar23 = fVar23 * fVar26;
      local_128 = (float)uVar2;
      fStack_124 = (float)((ulong)uVar2 >> 0x20);
      fVar24 = roundf(local_128 + 1.0);
      fVar25 = roundf(fStack_124 + 1.0);
      fVar24 = fVar24 * fVar26 - fVar22;
      fVar26 = fVar25 * fVar26 - fVar23;
      iVar20 = -(uint)(fVar24 < 0.1);
      iVar21 = -(uint)(fVar26 < 0.1);
      auVar6._4_4_ = iVar20;
      auVar6._0_4_ = iVar20;
      auVar6._8_4_ = iVar21;
      auVar6._12_4_ = iVar21;
      uVar7 = movmskpd(extraout_EAX,auVar6);
      local_12c = 0.1;
      local_128 = 0.1;
      if ((uVar7 & 1) == 0) {
        local_128 = fVar24;
      }
      if ((uVar7 & 2) == 0) {
        local_12c = fVar26;
      }
      local_128 = local_128 / (float)this->pooled_width;
      local_12c = local_12c / (float)this->pooled_height;
      for (iVar21 = 0; iVar20 = 0, iVar21 < this->output_dim; iVar21 = iVar21 + 1) {
        Mat::channel(&local_70,this_01,iVar21);
        local_f8 = local_70.data;
        Mat::~Mat(&local_70);
        iVar20 = 0;
        while (iVar20 < this->pooled_height) {
          fVar26 = floorf((float)iVar20 * local_12c + fVar23);
          fVar24 = ceilf((float)(iVar20 + 1) * local_12c + fVar23);
          iVar11 = (int)fVar24;
          uVar13 = (ulong)(uint)(int)fVar26;
          if ((int)fVar26 < 1) {
            uVar13 = 0;
          }
          iVar12 = (int)uVar13;
          iVar8 = iVar12;
          if (iVar4 < iVar12) {
            iVar8 = iVar4;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (iVar4 < iVar11) {
            iVar11 = iVar4;
          }
          uVar10 = (long)iVar4;
          if ((long)uVar13 < (long)iVar4) {
            uVar10 = uVar13;
          }
          lVar14 = 0;
          while( true ) {
            iVar5 = this->pooled_width;
            if (iVar5 <= lVar14) break;
            Mat::channel(&local_70,this_00,
                         (this->pooled_height * iVar21 + iVar20) * iVar5 + (int)lVar14);
            pvVar15 = (void *)((long)local_70.data + uVar18 * 4 * uVar10);
            Mat::~Mat(&local_70);
            fVar26 = floorf((float)(int)lVar14 * local_128 + fVar22);
            fVar24 = ceilf((float)(int)(lVar14 + 1) * local_128 + fVar22);
            uVar9 = (uint)fVar24;
            uVar7 = (int)fVar26;
            if ((int)fVar26 < 1) {
              uVar7 = 0;
            }
            uVar16 = uVar7;
            if ((int)uVar3 < (int)uVar7) {
              uVar16 = uVar3;
            }
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            if ((int)uVar3 < (int)uVar9) {
              uVar9 = uVar3;
            }
            uVar13 = (ulong)uVar7;
            if ((long)uVar18 <= (long)(ulong)uVar7) {
              uVar13 = uVar18;
            }
            fVar26 = 0.0;
            for (uVar17 = uVar10; uVar19 = uVar13, (long)uVar17 < (long)iVar11; uVar17 = uVar17 + 1)
            {
              for (; (long)uVar19 < (long)(int)uVar9; uVar19 = uVar19 + 1) {
                fVar26 = fVar26 + *(float *)((long)pvVar15 + uVar19 * 4);
              }
              pvVar15 = (void *)((long)pvVar15 + uVar18 * 4);
            }
            fVar24 = 0.0;
            if ((int)uVar7 < (int)uVar9 && iVar12 < iVar11) {
              fVar24 = fVar26 / (float)(int)((uVar9 - uVar16) * (iVar11 - iVar8));
            }
            *(float *)((long)local_f8 + lVar14 * 4) = fVar24;
            lVar14 = lVar14 + 1;
          }
          local_f8 = (void *)((long)local_f8 + (long)iVar5 * 4);
          iVar20 = iVar20 + 1;
        }
      }
    }
  }
  else {
    iVar20 = -1;
  }
  return iVar20;
}

Assistant:

int PSROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    if (channels != output_dim * pooled_width * pooled_height)
    {
        // input channel number does not match layer parameters
        return -1;
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, output_dim, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = round(roi_ptr[0]) * spatial_scale;
    float roi_y1 = round(roi_ptr[1]) * spatial_scale;
    float roi_x2 = round(roi_ptr[2] + 1.f) * spatial_scale;
    float roi_y2 = round(roi_ptr[3] + 1.f) * spatial_scale;

    float roi_w = std::max(roi_x2 - roi_x1, 0.1f);
    float roi_h = std::max(roi_y2 - roi_y1, 0.1f);

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<output_dim; q++)
    {
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                const float* ptr = bottom_blob.channel((q * pooled_height + ph) * pooled_width + pw);

                int hstart = floor(roi_y1 + (float)(ph) * bin_size_h);
                int wstart = floor(roi_x1 + (float)(pw) * bin_size_w);
                int hend = ceil(roi_y1 + (float)(ph + 1) * bin_size_h);
                int wend = ceil(roi_x1 + (float)(pw + 1) * bin_size_w);

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);
                int area = (hend - hstart) * (wend - wstart);

                float sum = 0.f;
                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        sum += ptr[index];
                    }
                }

                outptr[pw] = is_empty ? 0.f : (sum / (float)area);
            }

            outptr += pooled_width;
        }
    }

    return 0;
}